

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O2

void __thiscall
DenseHashSetIfaceTest_BucketBeginEnd_Test::~DenseHashSetIfaceTest_BucketBeginEnd_Test
          (DenseHashSetIfaceTest_BucketBeginEnd_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(DenseHashSetIfaceTest, BucketBeginEnd)
{
    dense_hash_set<int> h;
    h.set_empty_key(0);
    h.set_deleted_key(-1);

    EXPECT_TRUE(h.begin(0) == h.end(0)) << "empty set";
    EXPECT_TRUE(h.begin(10) == h.end(10)) << "empty set";
    EXPECT_TRUE(h.cbegin(0) == h.cend(0)) << "empty set";
    EXPECT_TRUE(h.cbegin(10) == h.cend(10)) << "empty set";

    h.insert(1);
    const auto n1 = h.bucket(1);
    EXPECT_FALSE(h.begin(n1) == h.end(n1)) << "singleton set";
    EXPECT_EQ(1, std::distance(h.begin(n1), h.end(n1))) << "singleton set";
    EXPECT_FALSE(h.cbegin(n1) == h.cend(n1)) << "singleton set";
    EXPECT_EQ(1, *h.cbegin(n1)) << "singleton set";

    h.insert(2);
    const auto n2 = h.bucket(2);
    EXPECT_FALSE(h.begin(n1) == h.end(n1)) << "two elements set";
    EXPECT_EQ(1, std::distance(h.begin(n1), h.end(n1))) << "two elements set";
    EXPECT_FALSE(h.begin(n2) == h.end(n2)) << "two elements set";
    EXPECT_EQ(1, std::distance(h.begin(n2), h.end(n2))) << "two elements set";
    EXPECT_EQ(1, std::distance(h.cbegin(n1), h.cend(n1))) << "two elements set";
    EXPECT_EQ(1, std::distance(h.cbegin(n2), h.cend(n2))) << "two elements set";
    EXPECT_EQ(1, *h.cbegin(n1)) << "two elements set";
    EXPECT_EQ(2, *h.cbegin(n2)) << "two elements set";
}